

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcAnalyzer.cpp
# Opt level: O3

void __thiscall
HdlcAnalyzer::ProcessFcsField(HdlcAnalyzer *this,vector<HdlcByte,_std::allocator<HdlcByte>_> *fcs)

{
  HdlcFcsType HVar1;
  pointer puVar2;
  pointer puVar3;
  HdlcAnalyzer *pHVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  pointer puVar8;
  pointer puVar9;
  size_t __len;
  size_t __n;
  Frame frame;
  vector<unsigned_char,_std::allocator<unsigned_char>_> readFcs;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_80;
  ulong local_68;
  undefined2 local_60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  pointer local_40;
  HdlcAnalyzer *local_38;
  
  HdlcBytesToVectorBytes(&local_58,(HdlcAnalyzer *)fcs,fcs);
  HVar1 = ((this->mSettings)._M_ptr)->mHdlcFcs;
  if (HVar1 == HDLC_CRC32) {
    puVar9 = (this->mCurrentFrameBytes).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (3 < (ulong)((long)puVar9 -
                   (long)(this->mCurrentFrameBytes).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start)) {
      (this->mCurrentFrameBytes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = puVar9 + -4;
    }
    HdlcSimulationDataGenerator::Crc32(&local_80,&this->mCurrentFrameBytes);
    puVar9 = local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  else if (HVar1 == HDLC_CRC16) {
    puVar9 = (this->mCurrentFrameBytes).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (1 < (ulong)((long)puVar9 -
                   (long)(this->mCurrentFrameBytes).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start)) {
      (this->mCurrentFrameBytes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = puVar9 + -2;
    }
    HdlcSimulationDataGenerator::Crc16(&local_80,&this->mCurrentFrameBytes);
    puVar9 = local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  else if (HVar1 == HDLC_CRC8) {
    puVar9 = (this->mCurrentFrameBytes).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if ((this->mCurrentFrameBytes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
        ._M_impl.super__Vector_impl_data._M_start != puVar9) {
      (this->mCurrentFrameBytes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = puVar9 + -1;
    }
    HdlcSimulationDataGenerator::Crc8(&local_80,&this->mCurrentFrameBytes);
    puVar9 = local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  else {
    local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    puVar9 = (pointer)0x0;
  }
  if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    puVar8 = (pointer)0x0;
  }
  else {
    iVar5 = (int)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish * 8 +
            (int)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start * -8;
    uVar6 = 0;
    puVar8 = (pointer)0x0;
    do {
      iVar5 = iVar5 + -8;
      puVar8 = (pointer)((ulong)puVar8 |
                        (long)(int)((uint)local_58.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start[uVar6] <<
                                   ((byte)iVar5 & 0x1f)));
      uVar6 = uVar6 + 1;
    } while ((uVar6 & 0xffffffff) <
             (ulong)((long)local_58.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                    (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start));
  }
  __n = (long)local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)puVar9;
  if (__n == 0) {
    uVar6 = 0;
  }
  else {
    iVar5 = (int)local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish * 8 + (int)puVar9 * -8;
    uVar7 = 0;
    uVar6 = 0;
    do {
      iVar5 = iVar5 + -8;
      uVar6 = uVar6 | (long)(int)((uint)puVar9[uVar7] << ((byte)iVar5 & 0x1f));
      uVar7 = uVar7 + 1;
    } while ((uVar7 & 0xffffffff) < __n);
  }
  puVar2 = (pointer)((fcs->super__Vector_base<HdlcByte,_std::allocator<HdlcByte>_>)._M_impl.
                     super__Vector_impl_data._M_start)->startSample;
  puVar3 = (pointer)(fcs->super__Vector_base<HdlcByte,_std::allocator<HdlcByte>_>)._M_impl.
                    super__Vector_impl_data._M_finish[-1].endSample;
  local_40 = local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
  local_38 = this;
  Frame::Frame((Frame *)&local_80);
  local_60 = 6;
  local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = puVar2;
  local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar3;
  local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = puVar8;
  local_68 = uVar6;
  if ((__n != (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start) ||
     ((local_40 != puVar9 &&
      (iVar5 = bcmp(puVar9,local_58.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,__n), iVar5 != 0)))) {
    local_60 = CONCAT11(0x80,(undefined1)local_60);
  }
  pHVar4 = local_38;
  std::vector<Frame,_std::allocator<Frame>_>::push_back
            (&local_38->mResultFrames,(value_type *)&local_80);
  AnalyzerResults::AddMarker
            ((ulonglong)(pHVar4->mResults)._M_ptr,
             (MarkerType)
             local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish,(Channel *)0x9);
  Frame::~Frame((Frame *)&local_80);
  if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (puVar9 != (pointer)0x0) {
    operator_delete(puVar9);
  }
  return;
}

Assistant:

void HdlcAnalyzer::ProcessFcsField( const vector<HdlcByte>& fcs )
{
    vector<U8> calculatedFcs;
    vector<U8> readFcs = HdlcBytesToVectorBytes( fcs );

    switch( mSettings->mHdlcFcs )
    {
    case HDLC_CRC8:
    {
        if( !mCurrentFrameBytes.empty() )
        {
            mCurrentFrameBytes.pop_back();
        }
        calculatedFcs = HdlcSimulationDataGenerator::Crc8( mCurrentFrameBytes );
        break;
    }
    case HDLC_CRC16:
    {
        if( mCurrentFrameBytes.size() >= 2 )
        {
            mCurrentFrameBytes.erase( mCurrentFrameBytes.end() - 2, mCurrentFrameBytes.end() );
        }
        calculatedFcs = HdlcSimulationDataGenerator::Crc16( mCurrentFrameBytes );
        break;
    }
    case HDLC_CRC32:
    {
        if( mCurrentFrameBytes.size() >= 4 )
        {
            mCurrentFrameBytes.erase( mCurrentFrameBytes.end() - 4, mCurrentFrameBytes.end() );
        }
        calculatedFcs = HdlcSimulationDataGenerator::Crc32( mCurrentFrameBytes );
        break;
    }
    }

    Frame frame = CreateFrame( HDLC_FIELD_FCS, fcs.front().startSample, fcs.back().endSample, VectorToValue( readFcs ),
                               VectorToValue( calculatedFcs ) );

    if( calculatedFcs != readFcs )
    {
        frame.mFlags = DISPLAY_AS_ERROR_FLAG;
    }

    AddFrameToResults( frame );

    // Put a marker in the end of the HDLC frame
    mResults->AddMarker( frame.mEndingSampleInclusive, AnalyzerResults::Stop, mSettings->mInputChannel );
}